

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_graphics_pipeline
          (Impl *this,VkGraphicsPipelineCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkGraphicsPipelineCreateInfo **out_create_info)

{
  VkPipelineColorBlendStateCreateInfo *pVVar1;
  VkPipelineColorBlendAttachmentState *__src;
  VkPipelineVertexInputStateCreateInfo *pVVar2;
  VkVertexInputAttributeDescription *__src_00;
  VkVertexInputBindingDescription *__src_01;
  VkPipelineViewportStateCreateInfo *pVVar3;
  VkViewport *__src_02;
  VkRect2D *__src_03;
  VkPipelineMultisampleStateCreateInfo *pVVar4;
  VkSampleMask *__src_04;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  VkGraphicsPipelineCreateInfo *info;
  ulong uVar8;
  int *piVar9;
  VkPipeline pVVar10;
  VkPipelineColorBlendAttachmentState *__dest;
  VkVertexInputAttributeDescription *__dest_00;
  VkVertexInputBindingDescription *__dest_01;
  VkViewport *__dest_02;
  VkRect2D *__dest_03;
  VkSampleMask *__dest_04;
  int *piVar11;
  VkGraphicsPipelineLibraryFlagsEXT state_flags;
  VkPipelineViewportStateCreateInfo *vp;
  size_t sVar12;
  VkPipelineColorBlendStateCreateInfo *blend;
  long *in_FS_OFFSET;
  GlobalStateInfo GVar13;
  DynamicStateInfo dynamic_info;
  SubpassMeta local_d2;
  VkPipelineVertexInputStateCreateInfo **local_d0;
  DynamicStateInfo local_c8;
  VkPipelineViewportStateCreateInfo **local_80;
  VkPipelineMultisampleStateCreateInfo **local_78;
  DynamicStateInfo local_70;
  
  info = (VkGraphicsPipelineCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x90,0x10);
  if (info != (VkGraphicsPipelineCreateInfo *)0x0) {
    memmove(info,create_info,0x90);
  }
  local_d2.uses_color = true;
  local_d2.uses_depth_stencil = true;
  local_c8.color_blend_advanced = false;
  local_c8.provoking_vertex_mode = false;
  local_c8.line_rasterization_mode = false;
  local_c8.line_stipple_enable = false;
  local_c8.depth_clip_negative_one_to_one = false;
  local_c8.viewport_w_scaling_enable = false;
  local_c8.viewport_swizzle = false;
  local_c8.coverage_to_color_enable = false;
  local_c8.coverage_to_color_location = false;
  local_c8.coverage_modulation_mode = false;
  local_c8.coverage_modulation_table_enable = false;
  local_c8.coverage_modulation_table = false;
  local_c8.shading_rate_image_enable = false;
  local_c8.representative_fragment_test_enable = false;
  local_c8.coverage_reduction_mode = false;
  local_c8.depth_clamp_range = false;
  local_c8.tessellation_domain_origin = false;
  local_c8.depth_clamp_enable = false;
  local_c8.polygon_mode = false;
  local_c8.rasterization_samples = false;
  local_c8.sample_mask = false;
  local_c8.alpha_to_coverage_enable = false;
  local_c8.alpha_to_one_enable = false;
  local_c8.logic_op_enable = false;
  local_c8.color_blend_enable = false;
  local_c8.color_blend_equation = false;
  local_c8.color_write_mask = false;
  local_c8.rasterization_stream = false;
  local_c8.conservative_rasterization_mode = false;
  local_c8.extra_primitive_overestimation_size = false;
  local_c8.depth_clip_enable = false;
  local_c8.sample_locations_enable = false;
  local_c8.depth_bounds_test_enable = false;
  local_c8.stencil_test_enable = false;
  local_c8.stencil_op = false;
  local_c8.vertex_input = false;
  local_c8.vertex_input_binding_stride = false;
  local_c8.patch_control_points = false;
  local_c8.rasterizer_discard_enable = false;
  local_c8.primitive_restart_enable = false;
  local_c8.logic_op = false;
  local_c8.color_write_enable = false;
  local_c8.depth_bias_enable = false;
  local_c8.discard_rectangle = false;
  local_c8.discard_rectangle_mode = false;
  local_c8.fragment_shading_rate = false;
  local_c8.sample_locations = false;
  local_c8.line_stipple = false;
  local_c8.stencil_compare = false;
  local_c8.stencil_reference = false;
  local_c8.stencil_write_mask = false;
  local_c8.depth_bounds = false;
  local_c8.depth_bias = false;
  local_c8.line_width = false;
  local_c8.blend_constants = false;
  local_c8.scissor = false;
  local_c8.viewport = false;
  local_c8.scissor_count = false;
  local_c8.viewport_count = false;
  local_c8.cull_mode = false;
  local_c8.front_face = false;
  local_c8.depth_test_enable = false;
  local_c8.depth_write_enable = false;
  local_c8.depth_compare_op = false;
  if (create_info->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    Hashing::parse_dynamic_state_info(&local_70,create_info->pDynamicState);
    local_c8.color_blend_advanced = local_70.color_blend_advanced;
    local_c8.provoking_vertex_mode = local_70.provoking_vertex_mode;
    local_c8.line_rasterization_mode = local_70.line_rasterization_mode;
    local_c8.line_stipple_enable = local_70.line_stipple_enable;
    local_c8.depth_clip_negative_one_to_one = local_70.depth_clip_negative_one_to_one;
    local_c8.viewport_w_scaling_enable = local_70.viewport_w_scaling_enable;
    local_c8.viewport_swizzle = local_70.viewport_swizzle;
    local_c8.coverage_to_color_enable = local_70.coverage_to_color_enable;
    local_c8.coverage_to_color_location = local_70.coverage_to_color_location;
    local_c8.coverage_modulation_mode = local_70.coverage_modulation_mode;
    local_c8.coverage_modulation_table_enable = local_70.coverage_modulation_table_enable;
    local_c8.coverage_modulation_table = local_70.coverage_modulation_table;
    local_c8.shading_rate_image_enable = local_70.shading_rate_image_enable;
    local_c8.representative_fragment_test_enable = local_70.representative_fragment_test_enable;
    local_c8.coverage_reduction_mode = local_70.coverage_reduction_mode;
    local_c8.depth_clamp_range = local_70.depth_clamp_range;
    local_c8.tessellation_domain_origin = local_70.tessellation_domain_origin;
    local_c8.depth_clamp_enable = local_70.depth_clamp_enable;
    local_c8.polygon_mode = local_70.polygon_mode;
    local_c8.rasterization_samples = local_70.rasterization_samples;
    local_c8.sample_mask = local_70.sample_mask;
    local_c8.alpha_to_coverage_enable = local_70.alpha_to_coverage_enable;
    local_c8.alpha_to_one_enable = local_70.alpha_to_one_enable;
    local_c8.logic_op_enable = local_70.logic_op_enable;
    local_c8.color_blend_enable = local_70.color_blend_enable;
    local_c8.color_blend_equation = local_70.color_blend_equation;
    local_c8.color_write_mask = local_70.color_write_mask;
    local_c8.rasterization_stream = local_70.rasterization_stream;
    local_c8.conservative_rasterization_mode = local_70.conservative_rasterization_mode;
    local_c8.extra_primitive_overestimation_size = local_70.extra_primitive_overestimation_size;
    local_c8.depth_clip_enable = local_70.depth_clip_enable;
    local_c8.sample_locations_enable = local_70.sample_locations_enable;
    local_c8.depth_bounds_test_enable = local_70.depth_bounds_test_enable;
    local_c8.stencil_test_enable = local_70.stencil_test_enable;
    local_c8.stencil_op = local_70.stencil_op;
    local_c8.vertex_input = local_70.vertex_input;
    local_c8.vertex_input_binding_stride = local_70.vertex_input_binding_stride;
    local_c8.patch_control_points = local_70.patch_control_points;
    local_c8.rasterizer_discard_enable = local_70.rasterizer_discard_enable;
    local_c8.primitive_restart_enable = local_70.primitive_restart_enable;
    local_c8.logic_op = local_70.logic_op;
    local_c8.color_write_enable = local_70.color_write_enable;
    local_c8.depth_bias_enable = local_70.depth_bias_enable;
    local_c8.discard_rectangle = local_70.discard_rectangle;
    local_c8.discard_rectangle_mode = local_70.discard_rectangle_mode;
    local_c8.fragment_shading_rate = local_70.fragment_shading_rate;
    local_c8.sample_locations = local_70.sample_locations;
    local_c8.line_stipple = local_70.line_stipple;
    local_c8.stencil_compare = local_70.stencil_compare;
    local_c8.stencil_reference = local_70.stencil_reference;
    local_c8.stencil_write_mask = local_70.stencil_write_mask;
    local_c8.depth_bounds = local_70.depth_bounds;
    local_c8.depth_bias = local_70.depth_bias;
    local_c8.line_width = local_70.line_width;
    local_c8.blend_constants = local_70.blend_constants;
    local_c8.scissor = local_70.scissor;
    local_c8.viewport = local_70.viewport;
    local_c8.scissor_count = local_70.scissor_count;
    local_c8.viewport_count = local_70.viewport_count;
    local_c8.cull_mode = local_70.cull_mode;
    local_c8.front_face = local_70.front_face;
    local_c8.depth_test_enable = local_70.depth_test_enable;
    local_c8.depth_write_enable = local_70.depth_write_enable;
    local_c8.depth_compare_op = local_70.depth_compare_op;
  }
  GVar13 = Hashing::parse_global_state_info(create_info,&local_c8,&local_d2);
  uVar8 = GVar13._0_8_;
  piVar9 = (int *)info->pNext;
  for (piVar11 = piVar9; piVar11 != (int *)0x0; piVar11 = *(int **)(piVar11 + 2)) {
    if (*piVar11 == 0x3b9fac02) goto LAB_00123f0d;
  }
  piVar11 = (int *)0x0;
LAB_00123f0d:
  state_flags = 0xf;
  if (piVar11 != (int *)0x0 && (info->flags >> 0xb & 1) != 0) {
    state_flags = piVar11[4];
  }
  if (((undefined1  [11])GVar13 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    info->pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  }
  if ((uVar8 >> 0x30 & 1) == 0) {
    info->pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)0x0;
  }
  if ((uVar8 >> 0x20 & 1) == 0) {
    info->pDepthStencilState = (VkPipelineDepthStencilStateCreateInfo *)0x0;
  }
  if ((uVar8 >> 0x28 & 1) == 0) {
    info->pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  }
  uVar6 = GVar13._0_4_;
  if ((uVar6 >> 8 & 1) == 0) {
    info->pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  }
  if ((uVar6 >> 0x10 & 1) == 0) {
    info->pViewportState = (VkPipelineViewportStateCreateInfo *)0x0;
  }
  if ((uVar6 >> 0x18 & 1) == 0) {
    info->pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)0x0;
  }
  if ((uVar8 >> 0x38 & 1) == 0) {
    info->pRasterizationState = (VkPipelineRasterizationStateCreateInfo *)0x0;
  }
  if (((undefined1  [11])GVar13 & (undefined1  [11])0x1) == (undefined1  [11])0x0) {
    info->renderPass = (VkRenderPass)0x0;
    info->subpass = 0;
  }
  if ((GVar13._8_3_ >> 8 & 1) == 0) {
    info->layout = (VkPipelineLayout)0x0;
  }
  info->flags = info->flags & 0x7ffffc3f;
  for (; piVar9 != (int *)0x0; piVar9 = *(int **)(piVar9 + 2)) {
    if (*piVar9 == 0x3ba1f5f5) goto LAB_00123fef;
  }
  piVar9 = (int *)0x0;
LAB_00123fef:
  if (piVar9 != (int *)0x0) {
    info->flags = 0;
  }
  if ((info->flags & 4) == 0) {
    pVVar10 = (VkPipeline)0x0;
  }
  else {
    if (info->basePipelineHandle != (VkPipeline)0x0) goto LAB_0012401a;
    uVar6 = info->basePipelineIndex;
    if ((long)(int)uVar6 < 0) goto LAB_0012401a;
    if (base_pipeline_count <= uVar6) {
      if (2 < *(int *)(*in_FS_OFFSET + -0x18)) {
        return false;
      }
      bVar5 = Internal::log_thread_callback(LOG_ERROR,"Base pipeline index is out of range.\n");
      if (!bVar5) {
        copy_graphics_pipeline();
        return false;
      }
      return false;
    }
    pVVar10 = base_pipelines[(int)uVar6];
  }
  info->basePipelineHandle = pVVar10;
LAB_0012401a:
  info->basePipelineIndex = -1;
  bVar5 = copy_sub_create_info<VkPipelineTessellationStateCreateInfo>
                    (this,&info->pTessellationState,alloc,&local_c8,state_flags);
  if (bVar5) {
    bVar5 = copy_sub_create_info<VkPipelineColorBlendStateCreateInfo>
                      (this,&info->pColorBlendState,alloc,&local_c8,state_flags);
    if (bVar5) {
      local_d0 = &info->pVertexInputState;
      bVar5 = copy_sub_create_info<VkPipelineVertexInputStateCreateInfo>
                        (this,local_d0,alloc,&local_c8,state_flags);
      if (bVar5) {
        local_78 = &info->pMultisampleState;
        bVar5 = copy_sub_create_info<VkPipelineMultisampleStateCreateInfo>
                          (this,local_78,alloc,&local_c8,state_flags);
        if (bVar5) {
          local_80 = &info->pViewportState;
          bVar5 = copy_sub_create_info<VkPipelineViewportStateCreateInfo>
                            (this,local_80,alloc,&local_c8,state_flags);
          if ((((bVar5) &&
               (bVar5 = copy_sub_create_info<VkPipelineInputAssemblyStateCreateInfo>
                                  (this,&info->pInputAssemblyState,alloc,&local_c8,state_flags),
               bVar5)) &&
              (bVar5 = copy_sub_create_info<VkPipelineDepthStencilStateCreateInfo>
                                 (this,&info->pDepthStencilState,alloc,&local_c8,state_flags), bVar5
              )) && (bVar5 = copy_sub_create_info<VkPipelineRasterizationStateCreateInfo>
                                       (this,&info->pRasterizationState,alloc,&local_c8,state_flags)
                    , bVar5)) {
            if ((GVar13._8_3_ >> 0x10 & 1) == 0) {
              info->stageCount = 0;
              info->pStages = (VkPipelineShaderStageCreateInfo *)0x0;
            }
            else {
              bVar5 = copy_stages<VkGraphicsPipelineCreateInfo>
                                (this,info,alloc,device,gsmcii,&local_c8);
              if (!bVar5) {
                return false;
              }
            }
            bVar5 = copy_dynamic_state<VkGraphicsPipelineCreateInfo>(this,info,alloc,&local_c8);
            if (bVar5) {
              pVVar1 = info->pColorBlendState;
              if (pVVar1 != (VkPipelineColorBlendStateCreateInfo *)0x0) {
                if (((local_c8.color_blend_enable == true) && (local_c8.color_write_mask == true))
                   && (local_c8.color_blend_equation == true)) {
                  pVVar1->pAttachments = (VkPipelineColorBlendAttachmentState *)0x0;
                }
                else {
                  if ((ulong)pVVar1->attachmentCount == 0) {
                    __dest = (VkPipelineColorBlendAttachmentState *)0x0;
                  }
                  else {
                    __src = pVVar1->pAttachments;
                    sVar12 = (ulong)pVVar1->attachmentCount << 5;
                    __dest = (VkPipelineColorBlendAttachmentState *)
                             ScratchAllocator::allocate_raw(alloc,sVar12,0x10);
                    if (__dest != (VkPipelineColorBlendAttachmentState *)0x0) {
                      memmove(__dest,__src,sVar12);
                    }
                  }
                  pVVar1->pAttachments = __dest;
                }
              }
              pVVar2 = *local_d0;
              if (pVVar2 != (VkPipelineVertexInputStateCreateInfo *)0x0) {
                if ((ulong)pVVar2->vertexAttributeDescriptionCount == 0) {
                  __dest_00 = (VkVertexInputAttributeDescription *)0x0;
                }
                else {
                  __src_00 = pVVar2->pVertexAttributeDescriptions;
                  sVar12 = (ulong)pVVar2->vertexAttributeDescriptionCount << 4;
                  __dest_00 = (VkVertexInputAttributeDescription *)
                              ScratchAllocator::allocate_raw(alloc,sVar12,0x10);
                  if (__dest_00 != (VkVertexInputAttributeDescription *)0x0) {
                    memmove(__dest_00,__src_00,sVar12);
                  }
                }
                pVVar2->pVertexAttributeDescriptions = __dest_00;
                if ((ulong)pVVar2->vertexBindingDescriptionCount == 0) {
                  __dest_01 = (VkVertexInputBindingDescription *)0x0;
                }
                else {
                  __src_01 = pVVar2->pVertexBindingDescriptions;
                  local_d0 = (VkPipelineVertexInputStateCreateInfo **)
                             ((ulong)pVVar2->vertexBindingDescriptionCount * 0xc);
                  __dest_01 = (VkVertexInputBindingDescription *)
                              ScratchAllocator::allocate_raw(alloc,(size_t)local_d0,0x10);
                  if (__dest_01 != (VkVertexInputBindingDescription *)0x0) {
                    memmove(__dest_01,__src_01,(size_t)local_d0);
                  }
                }
                pVVar2->pVertexBindingDescriptions = __dest_01;
              }
              pVVar3 = *local_80;
              if (pVVar3 != (VkPipelineViewportStateCreateInfo *)0x0) {
                __src_02 = pVVar3->pViewports;
                if (__src_02 != (VkViewport *)0x0) {
                  if ((ulong)pVVar3->viewportCount == 0) {
                    __dest_02 = (VkViewport *)0x0;
                  }
                  else {
                    sVar12 = (ulong)pVVar3->viewportCount * 0x18;
                    __dest_02 = (VkViewport *)ScratchAllocator::allocate_raw(alloc,sVar12,0x10);
                    if (__dest_02 != (VkViewport *)0x0) {
                      memmove(__dest_02,__src_02,sVar12);
                    }
                  }
                  pVVar3->pViewports = __dest_02;
                }
                __src_03 = pVVar3->pScissors;
                if (__src_03 != (VkRect2D *)0x0) {
                  if ((ulong)pVVar3->scissorCount == 0) {
                    __dest_03 = (VkRect2D *)0x0;
                  }
                  else {
                    sVar12 = (ulong)pVVar3->scissorCount << 4;
                    __dest_03 = (VkRect2D *)ScratchAllocator::allocate_raw(alloc,sVar12,0x10);
                    if (__dest_03 != (VkRect2D *)0x0) {
                      memmove(__dest_03,__src_03,sVar12);
                    }
                  }
                  pVVar3->pScissors = __dest_03;
                }
              }
              pVVar4 = *local_78;
              if (pVVar4 != (VkPipelineMultisampleStateCreateInfo *)0x0) {
                if (local_c8.sample_mask == true) {
                  pVVar4->pSampleMask = (VkSampleMask *)0x0;
                }
                __src_04 = pVVar4->pSampleMask;
                if (__src_04 != (VkSampleMask *)0x0) {
                  uVar6 = pVVar4->rasterizationSamples +
                          (VK_SAMPLE_COUNT_32_BIT|VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|
                           VK_SAMPLE_COUNT_4_BIT|VK_SAMPLE_COUNT_2_BIT);
                  if (uVar6 < 0x3f) {
                    __dest_04 = (VkSampleMask *)0x0;
                  }
                  else {
                    uVar7 = pVVar4->rasterizationSamples +
                            (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                             VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT);
                    if ((int)uVar7 < 0) {
                      uVar7 = uVar6;
                    }
                    local_d0 = (VkPipelineVertexInputStateCreateInfo **)
                               ((long)((int)uVar7 >> 5) << 2);
                    __dest_04 = (VkSampleMask *)
                                ScratchAllocator::allocate_raw(alloc,(size_t)local_d0,0x10);
                    if (__dest_04 != (VkSampleMask *)0x0) {
                      memmove(__dest_04,__src_04,(size_t)local_d0);
                    }
                  }
                  pVVar4->pSampleMask = __dest_04;
                }
              }
              bVar5 = copy_pnext_chain(this,info->pNext,alloc,&info->pNext,&local_c8,state_flags);
              if (bVar5) {
                *out_create_info = info;
                return true;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool StateRecorder::Impl::copy_graphics_pipeline(const VkGraphicsPipelineCreateInfo *create_info, ScratchAllocator &alloc,
                                                 const VkPipeline *base_pipelines, uint32_t base_pipeline_count,
                                                 VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                 VkGraphicsPipelineCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);

	// At the time of copy we don't really know the subpass meta state since the render pass is still being
	// parsed in a thread.
	// Assume that the subpass uses color or depth when copying.
	// This could in theory break if app passes pointer to invalid data while taking advantage of this
	// rule, but it has never happened so far ...
	const SubpassMeta subpass_meta = { true, true };

	DynamicStateInfo dynamic_info = {};
	if (create_info->pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*create_info->pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(*create_info, dynamic_info, subpass_meta);
	auto state_flags = graphics_pipeline_get_effective_state_flags(*info);

	// Remove pointers which a driver must ignore depending on other state.
	if (!global_info.input_assembly)
		info->pInputAssemblyState = nullptr;
	if (!global_info.vertex_input)
		info->pVertexInputState = nullptr;
	if (!global_info.depth_stencil_state)
		info->pDepthStencilState = nullptr;
	if (!global_info.color_blend_state)
		info->pColorBlendState = nullptr;
	if (!global_info.tessellation_state)
		info->pTessellationState = nullptr;
	if (!global_info.viewport_state)
		info->pViewportState = nullptr;
	if (!global_info.multisample_state)
		info->pMultisampleState = nullptr;
	if (!global_info.rasterization_state)
		info->pRasterizationState = nullptr;

	// If we can ignore render pass state, do just that.
	if (!global_info.render_pass_state)
	{
		info->renderPass = VK_NULL_HANDLE;
		info->subpass = 0;
	}

	if (!global_info.layout_state)
		info->layout = VK_NULL_HANDLE;

	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_sub_create_info(info->pTessellationState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pColorBlendState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pVertexInputState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pMultisampleState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pViewportState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pInputAssemblyState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pDepthStencilState, alloc, &dynamic_info, state_flags))
		return false;
	if (!copy_sub_create_info(info->pRasterizationState, alloc, &dynamic_info, state_flags))
		return false;

	if (global_info.module_state)
	{
		if (!copy_stages(info, alloc, device, gsmcii, &dynamic_info))
			return false;
	}
	else
	{
		info->stageCount = 0;
		info->pStages = nullptr;
	}

	if (!copy_dynamic_state(info, alloc, &dynamic_info))
		return false;

	if (info->pColorBlendState)
	{
		auto &blend = const_cast<VkPipelineColorBlendStateCreateInfo &>(*info->pColorBlendState);

		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
			blend.pAttachments = nullptr;
		else
			blend.pAttachments = copy(blend.pAttachments, blend.attachmentCount, alloc);
	}

	if (info->pVertexInputState)
	{
		auto &vs = const_cast<VkPipelineVertexInputStateCreateInfo &>(*info->pVertexInputState);
		vs.pVertexAttributeDescriptions = copy(vs.pVertexAttributeDescriptions, vs.vertexAttributeDescriptionCount, alloc);
		vs.pVertexBindingDescriptions = copy(vs.pVertexBindingDescriptions, vs.vertexBindingDescriptionCount, alloc);
	}

	if (info->pViewportState)
	{
		auto &vp = const_cast<VkPipelineViewportStateCreateInfo &>(*info->pViewportState);
		if (vp.pViewports)
			vp.pViewports = copy(vp.pViewports, vp.viewportCount, alloc);
		if (vp.pScissors)
			vp.pScissors = copy(vp.pScissors, vp.scissorCount, alloc);
	}

	if (info->pMultisampleState)
	{
		auto &ms = const_cast<VkPipelineMultisampleStateCreateInfo &>(*info->pMultisampleState);
		if (dynamic_info.sample_mask)
			ms.pSampleMask = nullptr;

		// If rasterizationSamples is dynamic, but not sample mask,
		// rasterizationSamples still provides the size of the sample mask array.
		if (ms.pSampleMask)
			ms.pSampleMask = copy(ms.pSampleMask, (ms.rasterizationSamples + 31) / 32, alloc);
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, &dynamic_info, state_flags))
		return false;

	*out_create_info = info;
	return true;
}